

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline_parser.cpp
# Opt level: O1

void __thiscall tlx::CmdlineParser::print_usage(CmdlineParser *this,ostream *os)

{
  Argument *pAVar1;
  char cVar2;
  size_t sVar3;
  ostream *poVar4;
  long lVar5;
  pointer ppAVar6;
  char *pcVar7;
  size_t sVar8;
  bool bVar9;
  string local_58;
  undefined4 local_34;
  
  local_34 = *(undefined4 *)(os + *(long *)(*(long *)os + -0x18) + 0x18);
  std::__ostream_insert<char,std::char_traits<char>>(os,"Usage: ",7);
  pcVar7 = this->program_name_;
  if (pcVar7 == (char *)0x0) {
    std::ios::clear((int)os + (int)*(undefined8 *)(*(long *)os + -0x18));
  }
  else {
    sVar3 = strlen(pcVar7);
    std::__ostream_insert<char,std::char_traits<char>>(os,pcVar7,sVar3);
  }
  bVar9 = (this->option_list_).
          super__Vector_base<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          (this->option_list_).
          super__Vector_base<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>
          ._M_impl.super__Vector_impl_data._M_finish;
  pcVar7 = " [options]";
  if (bVar9) {
    pcVar7 = "";
  }
  lVar5 = 10;
  if (bVar9) {
    lVar5 = 0;
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,pcVar7,lVar5);
  ppAVar6 = (this->param_list_).
            super__Vector_base<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppAVar6 !=
      (this->param_list_).
      super__Vector_base<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      pAVar1 = *ppAVar6;
      pcVar7 = " <";
      if (pAVar1->required_ == false) {
        pcVar7 = " [";
      }
      std::__ostream_insert<char,std::char_traits<char>>(os,pcVar7,2);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (os,(pAVar1->longkey_)._M_dataplus._M_p,(pAVar1->longkey_)._M_string_length
                         );
      pcVar7 = " ...";
      if (pAVar1->repeated_ == false) {
        pcVar7 = "";
      }
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,pcVar7,(ulong)pAVar1->repeated_ << 2);
      local_58._M_dataplus._M_p._0_1_ = 0x3e;
      if (pAVar1->required_ == false) {
        local_58._M_dataplus._M_p._0_1_ = 0x5d;
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&local_58,1);
      ppAVar6 = ppAVar6 + 1;
    } while (ppAVar6 !=
             (this->param_list_).
             super__Vector_base<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  cVar2 = (char)os;
  std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  if ((this->description_)._M_string_length != 0) {
    std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar2);
    std::ostream::put(cVar2);
    std::ostream::flush();
    output_wrap(os,&this->description_,(ulong)this->line_wrap_,0,0,0,0);
  }
  if ((this->author_)._M_string_length != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"Author: ",8);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (os,(this->author_)._M_dataplus._M_p,(this->author_)._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
  }
  if ((this->author_)._M_string_length != 0 || (this->description_)._M_string_length != 0) {
    std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar2);
    std::ostream::put(cVar2);
    std::ostream::flush();
  }
  if ((this->param_list_).
      super__Vector_base<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->param_list_).
      super__Vector_base<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"Parameters:",0xb);
    std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar2);
    std::ostream::put(cVar2);
    std::ostream::flush();
    ppAVar6 = (this->param_list_).
              super__Vector_base<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (ppAVar6 !=
        (this->param_list_).
        super__Vector_base<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        pAVar1 = *ppAVar6;
        std::__ostream_insert<char,std::char_traits<char>>(os,"  ",2);
        lVar5 = *(long *)os;
        *(long *)(os + *(long *)(lVar5 + -0x18) + 0x10) = (long)(int)this->param_max_width_;
        lVar5 = *(long *)(lVar5 + -0x18);
        *(uint *)(os + lVar5 + 0x18) = *(uint *)(os + lVar5 + 0x18) & 0xffffff4f | 0x20;
        Argument::param_text_abi_cxx11_(&local_58,pAVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  (os,(char *)CONCAT71(local_58._M_dataplus._M_p._1_7_,
                                       local_58._M_dataplus._M_p._0_1_),local_58._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_) !=
            &local_58.field_2) {
          operator_delete((undefined1 *)
                          CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_),
                          local_58.field_2._M_allocated_capacity + 1);
        }
        sVar8 = this->param_max_width_ + 2;
        output_wrap(os,&pAVar1->desc_,(ulong)this->line_wrap_,0,sVar8,sVar8,8);
        ppAVar6 = ppAVar6 + 1;
      } while (ppAVar6 !=
               (this->param_list_).
               super__Vector_base<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
  }
  if ((this->option_list_).
      super__Vector_base<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->option_list_).
      super__Vector_base<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"Options:",8);
    std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar2);
    std::ostream::put(cVar2);
    std::ostream::flush();
    ppAVar6 = (this->option_list_).
              super__Vector_base<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (ppAVar6 !=
        (this->option_list_).
        super__Vector_base<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        pAVar1 = *ppAVar6;
        std::__ostream_insert<char,std::char_traits<char>>(os,"  ",2);
        lVar5 = *(long *)os;
        *(long *)(os + *(long *)(lVar5 + -0x18) + 0x10) = (long)(int)this->option_max_width_;
        lVar5 = *(long *)(lVar5 + -0x18);
        *(uint *)(os + lVar5 + 0x18) = *(uint *)(os + lVar5 + 0x18) & 0xffffff4f | 0x20;
        Argument::option_text_abi_cxx11_(&local_58,pAVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  (os,(char *)CONCAT71(local_58._M_dataplus._M_p._1_7_,
                                       local_58._M_dataplus._M_p._0_1_),local_58._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_) !=
            &local_58.field_2) {
          operator_delete((undefined1 *)
                          CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_),
                          local_58.field_2._M_allocated_capacity + 1);
        }
        sVar8 = this->option_max_width_ + 2;
        output_wrap(os,&pAVar1->desc_,(ulong)this->line_wrap_,0,sVar8,sVar8,8);
        ppAVar6 = ppAVar6 + 1;
      } while (ppAVar6 !=
               (this->option_list_).
               super__Vector_base<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
  }
  *(undefined4 *)(os + *(long *)(*(long *)os + -0x18) + 0x18) = local_34;
  return;
}

Assistant:

void CmdlineParser::print_usage(std::ostream& os) {
    std::ios::fmtflags flags(os.flags());

    os << "Usage: " << program_name_
       << (!option_list_.empty() ? " [options]" : "");

    for (ArgumentList::const_iterator it = param_list_.begin();
         it != param_list_.end(); ++it) {
        const Argument* arg = *it;

        os << (arg->required_ ? " <" : " [") << arg->longkey_
           << (arg->repeated_ ? " ..." : "") << (arg->required_ ? '>' : ']');
    }

    os << std::endl;

    if (!description_.empty()) {
        os << std::endl;
        output_wrap(os, description_, line_wrap_);
    }
    if (!author_.empty()) {
        os << "Author: " << author_ << std::endl;
    }

    if (!description_.empty() || !author_.empty())
        os << std::endl;

    if (!param_list_.empty()) {
        os << "Parameters:" << std::endl;

        for (ArgumentList::const_iterator it = param_list_.begin();
             it != param_list_.end(); ++it) {
            const Argument* arg = *it;

            os << "  " << std::setw(static_cast<int>(param_max_width_))
               << std::left << arg->param_text();
            output_wrap(os, arg->desc_, line_wrap_, 0, param_max_width_ + 2,
                        param_max_width_ + 2, 8);
        }
    }

    if (!option_list_.empty()) {
        os << "Options:" << std::endl;

        for (ArgumentList::const_iterator it = option_list_.begin();
             it != option_list_.end(); ++it) {
            const Argument* arg = *it;

            os << "  " << std::setw(static_cast<int>(option_max_width_))
               << std::left << arg->option_text();
            output_wrap(os, arg->desc_, line_wrap_, 0, option_max_width_ + 2,
                        option_max_width_ + 2, 8);
        }
    }

    os.flags(flags);
}